

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ba_sparse_matrix.h
# Opt level: O0

void __thiscall
sfm::ba::SparseMatrix<double>::set_from_triplets(SparseMatrix<double> *this,Triplets *triplets)

{
  value_type vVar1;
  value_type vVar2;
  Triplet *pTVar3;
  size_t sVar4;
  pointer puVar5;
  pointer puVar6;
  size_type sVar7;
  const_reference pvVar8;
  reference pvVar9;
  Triplet *pTVar10;
  reference pvVar11;
  SparseMatrix<double> local_130;
  size_type local_d8;
  size_t pos;
  Triplet *t;
  size_t i_2;
  size_t temp;
  size_t i_1;
  undefined1 local_a8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> scratch;
  size_t sum;
  size_t i;
  undefined1 local_70 [8];
  SparseMatrix<double> transposed;
  Triplets *triplets_local;
  SparseMatrix<double> *this_local;
  
  transposed.inner.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)triplets;
  SparseMatrix((SparseMatrix<double> *)local_70,this->cols,this->rows);
  sVar7 = std::
          vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
          ::size((vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
                  *)transposed.inner.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)&transposed.cols,sVar7);
  sVar7 = std::
          vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
          ::size((vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
                  *)transposed.inner.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &transposed.outer.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,sVar7);
  sum = 0;
  while( true ) {
    sVar7 = std::
            vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
            ::size((vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
                    *)transposed.inner.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    if (sVar7 <= sum) break;
    pvVar8 = std::
             vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
             ::operator[]((vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
                           *)transposed.inner.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,sum);
    pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        &transposed.values.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,pvVar8->row);
    *pvVar9 = *pvVar9 + 1;
    sum = sum + 1;
  }
  scratch.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     &transposed.values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&i_1 + 7));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a8,sVar7,
             (allocator<unsigned_long> *)((long)&i_1 + 7));
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&i_1 + 7));
  temp = 0;
  while( true ) {
    sVar4 = temp;
    sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       &transposed.values.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (sVar7 <= sVar4) break;
    pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        &transposed.values.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,temp);
    puVar5 = scratch.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    i_2 = *pvVar9;
    pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        &transposed.values.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,temp);
    puVar6 = scratch.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    *pvVar9 = (value_type)puVar5;
    pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a8,temp);
    *pvVar9 = (value_type)puVar6;
    scratch.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)(i_2 + (long)scratch.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
    temp = temp + 1;
  }
  t = (Triplet *)0x0;
  while( true ) {
    pTVar3 = t;
    pTVar10 = (Triplet *)
              std::
              vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
              ::size((vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
                      *)transposed.inner.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    if (pTVar10 <= pTVar3) break;
    pos = (size_t)std::
                  vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
                  ::operator[]((vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
                                *)transposed.inner.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)t);
    pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a8,
                        ((const_reference)pos)->row);
    local_d8 = *pvVar9;
    *pvVar9 = local_d8 + 1;
    vVar1 = *(value_type *)(pos + 0x10);
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)&transposed.cols,local_d8);
    *pvVar11 = vVar1;
    vVar2 = *(value_type *)(pos + 8);
    pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        &transposed.outer.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,local_d8);
    *pvVar9 = vVar2;
    t = (Triplet *)((long)&t->row + 1);
  }
  transpose(&local_130,(SparseMatrix<double> *)local_70);
  operator=(this,&local_130);
  ~SparseMatrix(&local_130);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a8);
  ~SparseMatrix((SparseMatrix<double> *)local_70);
  return;
}

Assistant:

void
SparseMatrix<T>::set_from_triplets (Triplets const& triplets)
{
    /* Create a temporary transposed matrix */
    SparseMatrix<T> transposed(this->cols, this->rows);
    transposed.values.resize(triplets.size());
    transposed.inner.resize(triplets.size());

    // 统计每一行 Non-zero elements 的个数
    /* Initialize outer indices with amount of inner values. */
    for (std::size_t i = 0; i < triplets.size(); ++i)
        transposed.outer[triplets[i].row]++;

    /* Convert amounts to indices with prefix sum. */
    std::size_t sum = 0;
    std::vector<std::size_t> scratch(transposed.outer.size());
    for (std::size_t i = 0; i < transposed.outer.size(); ++i)
    {
        std::size_t const temp = transposed.outer[i];
        transposed.outer[i] = sum;
        scratch[i] = sum;
        sum += temp;
    }

    /* Add triplets, inner indices are unsorted. */
    for (std::size_t i = 0; i < triplets.size(); ++i)
    {
        Triplet const& t = triplets[i];
        std::size_t pos = scratch[t.row]++;
        transposed.values[pos] = t.value;
        transposed.inner[pos] = t.col;
    }

    /* Transpose matrix, implicit sorting of inner indices. */
    *this = transposed.transpose();
}